

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_common.h
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::
FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::Add
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *this,
          FieldDescriptor *field,
          unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
          *field_generator)

{
  Nonnull<const_char_*> pcVar1;
  _Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
  local_20 [2];
  
  if (field->containing_type_ == this->descriptor_) {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (field->containing_type_,this->descriptor_,
                        "field->containing_type() == descriptor_");
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    local_20[0]._M_head_impl =
         (field_generator->_M_t).
         super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
         .
         super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
         ._M_head_impl;
    (field_generator->_M_t).
    super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>.
    _M_head_impl = (ImmutableFieldLiteGenerator *)0x0;
    std::
    vector<google::protobuf::compiler::java::ImmutableFieldLiteGenerator_const*,std::allocator<google::protobuf::compiler::java::ImmutableFieldLiteGenerator_const*>>
    ::emplace_back<google::protobuf::compiler::java::ImmutableFieldLiteGenerator_const*>
              ((vector<google::protobuf::compiler::java::ImmutableFieldLiteGenerator_const*,std::allocator<google::protobuf::compiler::java::ImmutableFieldLiteGenerator_const*>>
                *)&this->field_generators_,&local_20[0]._M_head_impl);
    return;
  }
  Add();
}

Assistant:

void Add(const FieldDescriptor* field,
           std::unique_ptr<FieldGeneratorType> field_generator) {
    ABSL_CHECK_EQ(field->containing_type(), descriptor_);
    field_generators_.push_back(field_generator.release());
  }